

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main-spoil.c
# Opt level: O2

errr init_spoil(int argc,char **argv)

{
  int iVar1;
  char cVar2;
  _Bool _Var3;
  bool bVar4;
  bool bVar5;
  _Bool _Var6;
  int iVar7;
  ulong uVar8;
  ang_file *paVar9;
  ang_file *f;
  int *piVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  uint32_t uVar14;
  char *pcVar15;
  char *pcVar16;
  bool bVar17;
  char *local_868;
  uint32_t local_85c;
  char *local_840;
  char defname [1024];
  char *valend;
  
  iVar1 = argc + -1;
  bVar4 = false;
  local_868 = (char *)0x0;
  bVar5 = false;
  local_85c = 0;
  bVar17 = false;
  for (uVar13 = 1; (int)uVar13 < argc; uVar13 = uVar13 + iVar7) {
    pcVar16 = argv[uVar13];
    if (*pcVar16 == '-') {
      cVar2 = pcVar16[1];
      if (cVar2 != 's') {
        if (cVar2 == 'r') {
          if (pcVar16[2] == '\0') {
            if (iVar1 <= (int)uVar13) {
              pcVar16 = "init-spoil: \'%s\' requires an argument, the name of a randart file\n";
              goto LAB_00125bd1;
            }
            local_868 = argv[(ulong)uVar13 + 1];
            bVar4 = true;
            goto LAB_00125cac;
          }
        }
        else if ((cVar2 == 'p') && (pcVar16[2] == '\0')) {
          bVar4 = true;
          iVar7 = 1;
          local_868 = (char *)0x0;
          goto LAB_00125bdf;
        }
LAB_00125bad:
        for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 0x20) {
          if ((cVar2 == (&opts[0].letter)[lVar12]) && (pcVar16[2] == '\0')) {
            if ((int)uVar13 < iVar1) {
              (&opts[0].enabled)[lVar12] = true;
              *(char **)((long)&opts[0].path + lVar12) = argv[(ulong)uVar13 + 1];
              goto LAB_00125cac;
            }
            pcVar16 = "init-spoil: \'%s\' requires an argument, the name of the spoiler file\n";
            goto LAB_00125bd1;
          }
        }
        goto LAB_00125bca;
      }
      if (pcVar16[2] != '\0') goto LAB_00125bad;
      if (iVar1 <= (int)uVar13) {
        pcVar16 = "init-spoil: \'%s\' requires an argument, the randart seed\n";
        goto LAB_00125bd1;
      }
      uVar8 = strtoul(argv[(ulong)uVar13 + 1],&valend,0x10);
      if (((*argv[(ulong)uVar13 + 1] == '\0') || (_Var3 = contains_only_spaces(valend), !_Var3)) ||
         (uVar8 >> 0x20 != 0)) {
        if (uVar8 >> 0x20 == 0) {
          printf("init-spoil: \'%s\' requires an integer argument, the randart seed\n");
        }
        else {
          puts("init-spoil: seed is too large");
        }
        bVar17 = true;
      }
      else {
        bVar4 = true;
        bVar5 = true;
        local_85c = (uint32_t)uVar8;
      }
LAB_00125cac:
      iVar7 = 2;
    }
    else {
LAB_00125bca:
      pcVar16 = "init-spoil: bad argument \'%s\'\n";
LAB_00125bd1:
      printf(pcVar16);
      bVar17 = true;
      iVar7 = 1;
    }
LAB_00125bdf:
  }
  if (bVar17) {
    return 1;
  }
  init_angband();
  if (bVar4) {
    if (local_868 == (char *)0x0 && !bVar5) {
      safe_setuid_grab();
      _Var3 = file_exists(savefile);
      safe_setuid_drop();
      if (_Var3) {
        _Var3 = savefile_load(savefile,false);
        deactivate_randart_file();
        if (_Var3) goto LAB_00125f87;
        pcVar16 = 
        "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', failed to load.\n"
        ;
      }
      else {
        if (savefile[0] == '\0') {
          pcVar16 = 
          "init-spoil: using artifacts associated with a savefile, but main did not set the savefile."
          ;
          goto LAB_00125dda;
        }
        pcVar16 = 
        "init-spoil: using artifacts associated with a savefile, but the savefile set by main, \'%s\', does not exist.\n"
        ;
      }
      pcVar15 = savefile;
    }
    else {
      _Var3 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
      if (!_Var3) goto LAB_00125dd3;
      memset(defname,0,0x400);
      deactivate_randart_file();
      pcVar16 = option_name(0x1e);
      option_set(pcVar16,1);
      if (local_868 == (char *)0x0) {
        seed_randart = local_85c;
        do_randart(local_85c,true);
        uVar14 = seed_randart;
LAB_00125f56:
        seed_randart = uVar14;
        cleanup_parser(&artifact_parser);
        run_parser(&randart_parser);
        if (local_868 == (char *)0x0) {
          deactivate_randart_file();
        }
        else {
          file_delete(defname);
        }
LAB_00125f87:
        flavor_set_all_aware();
        for (lVar12 = 0; lVar12 != 0x80; lVar12 = lVar12 + 0x20) {
          if ((&opts[0].enabled)[lVar12] == true) {
            (**(code **)((long)&opts[0].func + lVar12))();
          }
        }
        cleanup_angband();
        exit(0);
      }
      path_build(defname,0x400,ANGBAND_DIR_USER,"randart.txt");
      paVar9 = file_open(local_868,MODE_READ,0xffffffff);
      if (paVar9 != (ang_file *)0x0) {
        f = file_open(defname,MODE_WRITE,FTYPE_TEXT);
        if (f == (ang_file *)0x0) {
          file_close(paVar9);
        }
        else {
          do {
            uVar13 = file_read(paVar9,(char *)&valend,0x400);
            bVar17 = uVar13 == 0;
            if ((int)uVar13 < 1) goto LAB_00125e55;
            _Var3 = file_write(f,(char *)&valend,(ulong)uVar13);
          } while (_Var3);
          bVar17 = false;
LAB_00125e55:
          _Var3 = file_close(f);
          _Var6 = file_close(paVar9);
          if (((bVar17) && (_Var6)) && (_Var3)) {
            paVar9 = file_open(local_868,MODE_READ,0xffffffff);
            uVar14 = 0;
            if (paVar9 != (ang_file *)0x0) {
              _Var3 = file_getl(paVar9,(char *)&valend,0x100);
              uVar14 = 0;
              if ((_Var3) && (pcVar16 = my_stristr((char *)&valend,"seed "), pcVar16 != (char *)0x0)
                 ) {
                piVar10 = __errno_location();
                *piVar10 = 0;
                uVar11 = strtoul(pcVar16 + 5,&local_840,0x10);
                uVar8 = 0;
                if (uVar11 < 0x100000000) {
                  uVar8 = uVar11;
                }
                uVar14 = (uint32_t)uVar8;
                if (local_840 == pcVar16 + 5) {
                  uVar14 = 0;
                }
              }
              file_close(paVar9);
            }
            goto LAB_00125f56;
          }
        }
      }
      pcVar16 = "init-spoil: could not copy randart file to \'%s\'.\n";
      pcVar15 = defname;
    }
    printf(pcVar16,pcVar15);
  }
  else {
    _Var3 = player_make_simple((char *)0x0,(char *)0x0,"Spoiler");
    if (_Var3) goto LAB_00125f87;
LAB_00125dd3:
    pcVar16 = "init-spoil: could not initialize player.";
LAB_00125dda:
    puts(pcVar16);
  }
  cleanup_angband();
  return 1;
}

Assistant:

errr init_spoil(int argc, char *argv[]) {
	/* Skip over argv[0] */
	int i = 1;
	int result = 0;
	bool load_randart = false;
	const char *randart_name = NULL;
	bool have_specified_seed = false;
	uint32_t specified_seed = 0;

	/* Parse the arguments. */
	while (1) {
		bool badarg = false;
		int increment = 1;

		if (i >= argc) {
			break;
		}

		if (argv[i][0] == '-') {
			/* Try to match with a known option. */
			if (argv[i][1] == 'p' && argv[i][2] == '\0') {
				load_randart = true;
				randart_name = NULL;
			} else if (argv[i][1] == 'r' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					load_randart = true;
					/* Record the name; don't parse it. */
					randart_name = argv[i + 1];
					++increment;
				} else {
					printf("init-spoil: '%s' requires an argument, the name of a randart file\n", argv[i]);
					result = 1;
				}
			} else if (argv[i][1] == 's' && argv[i][2] == '\0') {
				if (i < argc - 1) {
					char *valend;
					unsigned long val;

					val = strtoul(argv[i + 1], &valend, 16);
					++increment;
					if (argv[i + 1][0] != '\0'
							&& contains_only_spaces(valend)
							&& val <= 0xFFFFFFFFul) {
						load_randart = true;
						have_specified_seed = true;
						specified_seed = val;
					} else if (val > 0xFFFFFFFFul) {
						printf("init-spoil: seed is too large\n");
						result = 1;
					} else {
						printf("init-spoil: '%s' requires an integer argument, the randart seed\n",
							argv[i]);
						result = 1;
					}
				} else {
					printf("init-spoil: '%s' requires an argument, the randart seed\n", argv[i]);
					result = 1;
				}
			} else {
				int j = 0;

				while (1) {
					if (j >= (int)N_ELEMENTS(opts)) {
						badarg = true;
						break;
					}

					if (argv[i][1] == opts[j].letter &&
							argv[i][2] == '\0') {
						if (i < argc - 1) {
							opts[j].enabled = true;
							/*
							 * Record the filename
							 * and skip parsing
							 * of it.
							 */
							opts[j].path =
								argv[i + 1];
							++increment;
						} else {
							printf("init-spoil: '%s' requires an argument, the name of the spoiler file\n", argv[i]);
							result = 1;
						}
						break;
					}

					++j;
				}
			}
		} else {
			badarg = true;
		}

		if (badarg) {
			printf("init-spoil: bad argument '%s'\n", argv[i]);
			result = 1;
		}

		i += increment;
	}

	if (result != 0) return result;

	/* Generate the spoilers. */
	init_angband();

	if (load_randart) {
		if (randart_name || have_specified_seed) {
			if (player_make_simple(NULL, NULL, "Spoiler")) {
				char defname[1024] = "";

				deactivate_randart_file();
				option_set(option_name(OPT_birth_randarts),
					true);

				if (randart_name) {
					path_build(defname, sizeof(defname),
						ANGBAND_DIR_USER,
						"randart.txt");
					/*
					 * Copy rather than move in case the
					 * file supplied is read-only.
					 */
					if (copy_file(randart_name, defname,
							FTYPE_TEXT)) {
						seed_randart = parse_seed(randart_name);
					} else {
						printf("init-spoil: could not copy randart file to '%s'.\n", defname);
						result = 1;
					}
				} else {
					seed_randart = specified_seed;
					do_randart(seed_randart, true);
				}

				if (result == 0) {
					cleanup_parser(&artifact_parser);
					run_parser(&randart_parser);
					if (randart_name) {
						file_delete(defname);
					} else {
						deactivate_randart_file();
					}
				}
			} else {
				printf("init-spoil: could not initialize player.\n");
				result = 1;
			}
		} else {
			bool exists;

			safe_setuid_grab();
			exists = file_exists(savefile);
			safe_setuid_drop();
			if (exists) {
				bool loaded_save =
					savefile_load(savefile, false);

				deactivate_randart_file();
				if (!loaded_save) {
					printf("init-spoil: using artifacts "
						"associated with a savefile, "
						"but the savefile set by "
						"main, '%s', failed to load.\n",
						savefile);
					result = 1;
				}
			} else if (savefile[0]) {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but the savefile set "
					"by main, '%s', does not exist.\n",
					savefile);
				result = 1;
			} else {
				printf("init-spoil: using artifacts associated "
					"with a savefile, but main did not set "
					"the savefile.\n");
				result = 1;
			}
		}
	} else if (!player_make_simple(NULL, NULL, "Spoiler")) {
		printf("init-spoil: could not initialize player.\n");
		result = 1;
	}

	if (result == 0) {
		flavor_set_all_aware();
		for (i = 0; i < (int)N_ELEMENTS(opts); ++i) {
			if (!opts[i].enabled) continue;
			(*(opts[i].func))(opts[i].path);
		}
	}

	cleanup_angband();

	if (result == 0) {
		exit(0);
	}

	return result;
}